

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O2

void __thiscall QPathEdit::QPathEdit(QPathEdit *this,PathMode pathMode,QWidget *parent,Style style)

{
  ConnectionType type;
  undefined4 uVar1;
  QLineEdit *this_00;
  QCompleter *pQVar2;
  QFileSystemModel *pQVar3;
  PathValidator *this_01;
  QFileDialog *this_02;
  QToolButton *this_03;
  QAction *this_04;
  undefined4 *puVar4;
  QMargins *this_05;
  int extraout_var;
  ulong uVar5;
  QArrayDataPointer<char16_t> local_a8;
  undefined1 local_88 [16];
  qsizetype local_78;
  Object local_70 [8];
  Object local_68 [8];
  Object local_60 [8];
  QObject local_58 [8];
  Object local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001509a0;
  *(undefined ***)&this->field_0x10 = &PTR__QPathEdit_00150b50;
  this_00 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(this_00,&this->super_QWidget);
  this->edit = this_00;
  pQVar2 = (QCompleter *)operator_new(0x10);
  QCompleter::QCompleter(pQVar2,(QObject *)this);
  this->pathCompleter = pQVar2;
  pQVar3 = (QFileSystemModel *)operator_new(0x10);
  QFileSystemModel::QFileSystemModel(pQVar3,(QObject *)this);
  this->completerModel = pQVar3;
  this_01 = (PathValidator *)operator_new(0x18);
  PathValidator::PathValidator(this_01,(QObject *)this);
  this->pathValidator = this_01;
  this_02 = (QFileDialog *)operator_new(0x28);
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_88._0_8_ = (QIconPrivate *)0x0;
  local_88._8_8_ = (char16_t *)0x0;
  local_78 = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QFileDialog::QFileDialog
            (this_02,&this->super_QWidget,(QString *)&local_a8,(QString *)local_88,
             (QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  this->dialog = this_02;
  (this->currentValidPath).d.size = 0;
  (this->currentValidPath).d.d = (Data *)0x0;
  (this->currentValidPath).d.ptr = (char16_t *)0x0;
  this->wasPathValid = true;
  this->uiStyle = style;
  this->mode = ExistingFile;
  type = (ConnectionType)this;
  QStandardPaths::writableLocation(type + 0x78);
  this->allowEmpty = true;
  this_03 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(this_03,&this->super_QWidget);
  this->toolButton = this_03;
  this_04 = (QAction *)operator_new(0x10);
  getDefaultIcon((QPathEdit *)local_88);
  tr((QString *)&local_a8,"Open File-Dialog",(char *)0x0,-1);
  QAction::QAction(this_04,(QIcon *)local_88,(QString *)&local_a8,(QObject *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QIcon::~QIcon((QIcon *)local_88);
  this->dialogAction = this_04;
  this->hasCustomIcon = false;
  masterDialog((QDialog *)this->dialog);
  setPathMode(this,pathMode);
  local_a8.d = (Data *)dialogFileSelected;
  local_a8.ptr = (char16_t *)0x0;
  uVar5 = 0;
  QObject::connect<void(QFileDialog::*)(QString_const&),void(QPathEdit::*)(QString_const&)>
            (local_50,(offset_in_QFileDialog_to_subr)this->dialog,
             (Object *)QFileDialog::fileSelected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QString::QString((QString *)&local_a8,"");
  QFileSystemModel::setRootPath((QString *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QFileSystemModel::setNameFilterDisables(SUB81(this->completerModel,0));
  pQVar2 = this->pathCompleter;
  pQVar3 = this->completerModel;
  local_a8.d = (Data *)QFileSystemModel::directoryLoaded;
  local_a8.ptr = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/freeserf[P]fsstudio/src/qpathedit.cpp:66:11),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QPathEdit **)(puVar4 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)pQVar3,(QObject *)&local_a8,(void **)pQVar2,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)(uVar5 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QCompleter::setModel((QAbstractItemModel *)this->pathCompleter);
  this_05 = (QMargins *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_05,&this->super_QWidget);
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  QLayout::setContentsMargins(this_05);
  (**(code **)(*(long *)this_05 + 0x68))(this_05,0);
  QBoxLayout::addWidget(this_05,this->edit,0);
  QBoxLayout::addWidget(this_05,this->toolButton,0);
  QWidget::setLayout((QLayout *)this);
  QObject::installEventFilter((QObject *)this->edit);
  QLineEdit::setCompleter((QCompleter *)this->edit);
  QLineEdit::setValidator((QValidator *)this->edit);
  QLineEdit::setDragEnabled(SUB81(this->edit,0));
  QLineEdit::setReadOnly(SUB81(this->edit,0));
  local_a8.d = (Data *)editTextUpdate;
  local_a8.ptr = (char16_t *)0x0;
  QObject::connect<void(QLineEdit::*)(),void(QPathEdit::*)()>
            (local_60,(offset_in_QLineEdit_to_subr)this->edit,(Object *)QLineEdit::editingFinished,0
             ,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_a8.d = (Data *)updateValidInfo;
  local_a8.ptr = (char16_t *)0x0;
  QObject::connect<void(QLineEdit::*)(QString_const&),void(QPathEdit::*)(QString_const&)>
            (local_68,(offset_in_QLineEdit_to_subr)this->edit,(Object *)QLineEdit::textChanged,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_a8.d = (Data *)showDialog;
  local_a8.ptr = (char16_t *)0x0;
  QObject::connect<void(QAction::*)(bool),void(QPathEdit::*)()>
            (local_70,(offset_in_QAction_to_subr)this->dialogAction,(Object *)QAction::triggered,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QToolButton::setDefaultAction((QAction *)this->toolButton);
  (**(code **)(*(long *)this->edit + 0x70))();
  QWidget::setFixedSize((int)this->toolButton,extraout_var);
  if (style == JoinedButton) {
    QLineEdit::addAction((QAction *)this->edit,(ActionPosition)this->dialogAction);
  }
  else if (style != NoButton) goto LAB_00121a57;
  (**(code **)(*(long *)this->toolButton + 0x68))(this->toolButton,0);
LAB_00121a57:
  QWidget::setTabOrder((QWidget *)this->edit,(QWidget *)this->toolButton);
  uVar1 = QWidget::focusPolicy();
  QWidget::setFocusPolicy(this,uVar1);
  QWidget::setFocusProxy(&this->super_QWidget);
  return;
}

Assistant:

QPathEdit::QPathEdit(QPathEdit::PathMode pathMode, QWidget *parent,
                     QPathEdit::Style style)
  : QWidget(parent)
  , edit(new QLineEdit(this))
  , pathCompleter(new QCompleter(this)),
	completerModel(new QFileSystemModel(this)),
	pathValidator(new PathValidator(this)),
	dialog(new QFileDialog(this)),
	currentValidPath(),
	wasPathValid(true),
	uiStyle(style),
	mode(ExistingFile),
	defaultDir(QStandardPaths::writableLocation(QStandardPaths::HomeLocation)),
	allowEmpty(true),
	toolButton(new QToolButton(this)),
	dialogAction(new QAction(getDefaultIcon(), tr("Open File-Dialog"), this)),
	hasCustomIcon(false)
{
	//setup dialog
	masterDialog(dialog);
	setPathMode(pathMode);
	connect(dialog, &QFileDialog::fileSelected, this, &QPathEdit::dialogFileSelected);

	//setup completer
	completerModel->setRootPath("");
	completerModel->setNameFilterDisables(false);
	connect(completerModel, &QFileSystemModel::directoryLoaded, pathCompleter,
          [this](QString){ pathCompleter->complete(); });
	pathCompleter->setModel(completerModel);

	//setup this
	QHBoxLayout *layout = new QHBoxLayout(this);
	layout->setContentsMargins(QMargins());
	layout->setSpacing(0);
	layout->addWidget(edit);
	layout->addWidget(toolButton);
	setLayout(layout);
	//setup lineedit
	edit->installEventFilter(this);
	edit->setCompleter(pathCompleter);
	edit->setValidator(pathValidator);
	edit->setDragEnabled(true);
	edit->setReadOnly(true);
	connect(edit, &QLineEdit::editingFinished, this, &QPathEdit::editTextUpdate);
	connect(edit, &QLineEdit::textChanged, this, &QPathEdit::updateValidInfo);
	//setup "button"
	connect(dialogAction, &QAction::triggered, this, &QPathEdit::showDialog);
	toolButton->setDefaultAction(dialogAction);
	int height = edit->sizeHint().height();
#ifdef Q_OS_WIN
	height += 2;
#endif
	toolButton->setFixedSize(height, height);
	switch(style) {
	  case JoinedButton:
		  edit->addAction(dialogAction, QLineEdit::TrailingPosition);
	  case NoButton:
		  toolButton->setVisible(false);
		  break;
	  default:
		  break;
	}

	QWidget::setTabOrder(edit, toolButton);
	setFocusPolicy(edit->focusPolicy());
	setFocusProxy(edit);
}